

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O0

void __thiscall fs_tests::fsbridge_stem::test_method(fsbridge_stem *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  string expected_stem;
  string test_filename;
  char *in_stack_fffffffffffffe68;
  lazy_ostream *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  lazy_ostream *in_stack_fffffffffffffe90;
  string *string;
  path *this_00;
  allocator<char> *__a;
  char *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined1 local_138 [16];
  undefined1 local_128 [70];
  undefined1 local_e2 [122];
  undefined1 local_68 [32];
  lazy_ostream local_48 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = (allocator<char> *)(local_e2 + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,__a);
  std::allocator<char>::~allocator((allocator<char> *)(local_e2 + 1));
  this_00 = (path *)local_e2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,__a);
  std::allocator<char>::~allocator((allocator<char> *)local_e2);
  do {
    string = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,(const_string *)this_00,(size_t)string,
               (const_string *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe90 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe70,(char (*) [1])in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
    fs::PathFromString(string);
    std::filesystem::__cxx11::path::stem(this_00);
    fs::path::path((path *)in_stack_fffffffffffffe68,(path *)0x66e78b);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffe78 = "expected_stem";
    in_stack_fffffffffffffe70 = local_48;
    in_stack_fffffffffffffe68 = "fs::PathToString(fs::PathFromString(test_filename).stem())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_128,local_138,0x2c,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe68);
    fs::path::~path((path *)in_stack_fffffffffffffe68);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffe68);
    fs::path::~path((path *)in_stack_fffffffffffffe68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe68);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_stem)
{
    std::string test_filename = "fs_tests_₿_🏃.dat";
    std::string expected_stem = "fs_tests_₿_🏃";
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(test_filename).stem()), expected_stem);
}